

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall GdlPass::DebugRulePrecedence(GdlPass *this,GrcManager *pcman,ostream *strmOut)

{
  bool bVar1;
  int iVar2;
  size_type_conflict sVar3;
  ostream *poVar4;
  iterator pcman_00;
  iterator this_00;
  reference piVar5;
  reference ppGVar6;
  ostream *in_RDX;
  GdlPass *in_RDI;
  GdlRule *rule;
  int irule;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  uint seq;
  int nPassNum;
  vector<int,_std::allocator<int>_> viruleSorted;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffee8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffef0;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff10;
  value_type this_01;
  undefined4 in_stack_ffffffffffffff68;
  int iVar7;
  undefined1 fXml;
  GdlRule *this_02;
  uint local_78;
  undefined1 local_30 [48];
  
  local_30._24_8_ = in_RDX;
  sVar3 = std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::size(&in_RDI->m_vprule);
  if (sVar3 == 0) {
    poVar4 = std::operator<<((ostream *)local_30._24_8_,"\nPASS: ");
    iVar2 = PassDebuggerNumber(in_RDI);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::operator<<(poVar4," - no rules\n");
  }
  else {
    poVar4 = std::operator<<((ostream *)local_30._24_8_,"\nPASS: ");
    iVar2 = PassDebuggerNumber(in_RDI);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," (GDL #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI->m_nNumber);
    std::operator<<(poVar4,")\n");
    std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::size(&in_RDI->m_vprule);
    std::allocator<int>::allocator((allocator<int> *)0x115070);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10._M_current,
               (size_type_conflict)in_stack_ffffffffffffff08._M_current,
               (allocator_type *)in_stack_ffffffffffffff00.this);
    std::allocator<int>::~allocator((allocator<int> *)0x115096);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8._M_current);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,GdlPass::DebugRulePrecedence(GrcManager*,std::ostream&)::__0>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    iVar2 = PassDebuggerNumber(in_RDI);
    local_78 = 0;
    this_02 = (GdlRule *)local_30;
    pcman_00 = std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8._M_current);
    this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffee8._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffef0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffee8._M_current);
      if (!bVar1) break;
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &stack0xffffffffffffff78);
      iVar7 = *piVar5;
      ppGVar6 = std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::operator[]
                          (&in_RDI->m_vprule,(long)iVar7);
      this_01 = *ppGVar6;
      poVar4 = std::operator<<((ostream *)local_30._24_8_,"\n");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78);
      poVar4 = std::operator<<(poVar4," - RULE ");
      in_stack_ffffffffffffff00.this = (GdlPass *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<((ostream *)in_stack_ffffffffffffff00.this,".");
      in_stack_fffffffffffffef0._M_current = (int *)std::ostream::operator<<(poVar4,iVar7);
      std::operator<<((ostream *)in_stack_fffffffffffffef0._M_current,", ");
      in_stack_fffffffffffffee8._M_current =
           &GdlObject::LineAndFile(&this_01->super_GdlObject)->m_nLinePre;
      GrpLineAndFile::WriteToStream
                ((GrpLineAndFile *)this_00._M_current,
                 (ostream *)CONCAT44(iVar7,in_stack_ffffffffffffff68),
                 SUB81((ulong)this_01 >> 0x38,0));
      fXml = (undefined1)((uint)iVar7 >> 0x18);
      std::operator<<((ostream *)local_30._24_8_,":  ");
      GdlRule::RulePrettyPrint
                (this_02,(GrcManager *)pcman_00._M_current,(ostream *)this_00._M_current,(bool)fXml)
      ;
      std::operator<<((ostream *)local_30._24_8_,"\n\n");
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffff78);
      local_78 = local_78 + 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00.this);
  }
  return;
}

Assistant:

void GdlPass::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut)
{
	if (m_vprule.size() == 0)
	{
		strmOut << "\nPASS: " << PassDebuggerNumber() << " - no rules\n";
		return;
	}

	Assert(PassDebuggerNumber() != 0);

	strmOut << "\nPASS: " << PassDebuggerNumber() << " (GDL #" << this->m_nNumber << ")\n";

	// Stable sort rules by their precedence: by the number of items matched (largest first).
	std::vector<int> viruleSorted(m_vprule.size());
	std::iota(viruleSorted.begin(), viruleSorted.end(), 0);
	std::stable_sort(viruleSorted.begin(), viruleSorted.end(), [&](auto const a, auto const b){
		return m_vprule[a]->SortKey() > m_vprule[b]->SortKey();
	});

	auto const nPassNum = PassDebuggerNumber();
	auto seq = 0u;
	for (auto const irule: viruleSorted) 
	{
		auto & rule = *m_vprule[irule];
		strmOut << "\n" << seq++ << " - RULE " << nPassNum << "." << irule << ", ";
		rule.LineAndFile().WriteToStream(strmOut, true);
		strmOut << ":  ";

		rule.RulePrettyPrint(pcman, strmOut, false);
		strmOut << "\n\n";
	}
}